

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

int user_confirm(tgestate_t *state)

{
  byte bVar1;
  
  screenlocstring_plot(state,&user_confirm::screenlocstring_confirm_y_or_n);
  while( true ) {
    bVar1 = (*state->speccy->in)(state->speccy,0xdffe);
    if ((bVar1 & 0x10) == 0) {
      return 0;
    }
    bVar1 = (*state->speccy->in)(state->speccy,0x7ffe);
    if ((bVar1 & 8) == 0) break;
    gamedelay(state,70000);
  }
  return 1;
}

Assistant:

int user_confirm(tgestate_t *state)
{
  /** $F014 */
  static const screenlocstring_t screenlocstring_confirm_y_or_n =
  {
    0x100B, 15, "CONFIRM. Y OR N"
  };

  uint8_t keymask; /* was A */
  int     flags;   /* Conv: added */

  assert(state != NULL);

  screenlocstring_plot(state, &screenlocstring_confirm_y_or_n);

  /* Keyscan. */
  for (;;)
  {
    keymask = state->speccy->in(state->speccy, port_KEYBOARD_POIUY);
    if ((keymask & (1 << 4)) == 0)
    {
      flags = 0; /* is 'Y' pressed? return Z */
      goto exit;
    }

    keymask = state->speccy->in(state->speccy, port_KEYBOARD_SPACESYMSHFTMNB);
    keymask = ~keymask;
    if ((keymask & (1 << 3)) != 0)
    {
      flags = 1; /* is 'N' pressed? return NZ */
      goto exit;
    }

    /* Conv: Timing: The original game keyscans as fast as it can. We can't
     * have that so instead we introduce a short delay and handle game thread
     * termination. */
    gamedelay(state, 3500000 / 50); /* 50/sec */
  }

exit:
  return flags;
}